

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_serializer.cpp
# Opt level: O3

Table * getFromCsv(Table *__return_storage_ptr__,string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  istream *piVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  ulong *puVar10;
  long lVar11;
  _Alloc_hider _Var12;
  int cnt;
  Table *t;
  string cur;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columns;
  fstream in;
  int local_32c;
  value_type local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  ulong local_2e0;
  string local_2d8;
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string local_280;
  string local_260;
  long local_240 [66];
  
  std::fstream::fstream(local_240,(string *)fileName,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::operator+(&local_320,"File ",fileName);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_320);
    local_300 = (ulong *)*plVar9;
    puVar10 = (ulong *)(plVar9 + 2);
    if (local_300 == puVar10) {
      local_2f0 = *puVar10;
      lStack_2e8 = plVar9[3];
      local_300 = &local_2f0;
    }
    else {
      local_2f0 = *puVar10;
    }
    local_2f8 = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::operator<<((ostream *)&std::cerr,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    exit(1);
  }
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0 = local_2f0 & 0xffffffffffffff00;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_320._M_string_length = 0;
  local_320.field_2._M_local_buf[0] = '\0';
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar4 = std::ios::widen((char)local_240 + (char)*(undefined8 *)(local_240[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_240,(string *)&local_300,cVar4);
  std::__cxx11::string::push_back('\0');
  lVar3 = local_2f8;
  puVar10 = local_300;
  if (local_2f8 != 0) {
    lVar11 = 0;
    do {
      if (*(char *)((long)puVar10 + lVar11) == ',') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_298,&local_320);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_320,0,(char *)local_320._M_string_length,0x10c304);
      }
      else {
        std::__cxx11::string::push_back((char)&local_320);
      }
      lVar11 = lVar11 + 1;
    } while (lVar3 != lVar11);
  }
  Table::Table(__return_storage_ptr__,&local_298);
  paVar1 = &local_280.field_2;
  local_2e0 = 0;
  do {
    do {
      while( true ) {
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) +
                                (char)(istream *)local_240);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_240,(string *)&local_300,cVar4);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,
                            CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                     local_320.field_2._M_local_buf[0]) + 1);
          }
          if (local_300 != &local_2f0) {
            operator_delete(local_300,local_2f0 + 1);
          }
          std::fstream::~fstream(local_240);
          return __return_storage_ptr__;
        }
        uVar6 = std::__cxx11::string::push_back('\0');
        lVar3 = local_2f8;
        puVar10 = local_300;
        cVar4 = (char)&local_320;
        if ((local_2e0 & 1) == 0) break;
        if (local_2f8 != 0) {
          lVar11 = 0;
          cnt = 0;
          do {
            cVar2 = *(char *)((long)puVar10 + lVar11);
            if (cVar2 != ' ') {
              if (cVar2 == ',') {
                if ((int)*local_320._M_dataplus._M_p - 0x30U < 10) {
                  local_280._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_280,local_320._M_dataplus._M_p,
                             (char *)(local_320._M_string_length + (long)local_320._M_dataplus._M_p)
                            );
                  Table::push_new_value_in_column(__return_storage_ptr__,cnt,&local_280);
                  paVar7 = paVar1;
                  _Var12._M_p = local_280._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._M_dataplus._M_p != paVar1) {
LAB_00106245:
                    operator_delete(_Var12._M_p,paVar7->_M_allocated_capacity + 1);
                  }
                }
                else {
                  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2d8,local_320._M_dataplus._M_p,
                             (char *)(local_320._M_string_length + (long)local_320._M_dataplus._M_p)
                            );
                  Table::push_new_value_in_column(__return_storage_ptr__,cnt,&local_2d8);
                  paVar7 = &local_2d8.field_2;
                  _Var12._M_p = local_2d8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._M_dataplus._M_p != paVar7) goto LAB_00106245;
                }
                std::__cxx11::string::_M_replace
                          ((ulong)&local_320,0,(char *)local_320._M_string_length,0x10c304);
                cnt = cnt + 1;
              }
              else {
                std::__cxx11::string::push_back(cVar4);
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar3 != lVar11);
        }
      }
      local_2e0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
    } while (local_2f8 == 0);
    lVar11 = 0;
    local_32c = 0;
    paVar7 = &local_260.field_2;
    do {
      cVar2 = *(char *)((long)puVar10 + lVar11);
      if (cVar2 != ' ') {
        if (cVar2 == ',') {
          if ((int)*local_320._M_dataplus._M_p - 0x30U < 10) {
            Table::define_column_type(__return_storage_ptr__,local_32c,FLOAT);
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b8,local_320._M_dataplus._M_p,
                       (char *)(local_320._M_string_length + (long)local_320._M_dataplus._M_p));
            Table::push_new_value_in_column(__return_storage_ptr__,local_32c,&local_2b8);
            paVar8 = &local_2b8.field_2;
            _Var12._M_p = local_2b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
LAB_0010639c:
              operator_delete(_Var12._M_p,paVar8->_M_allocated_capacity + 1);
            }
          }
          else {
            Table::define_column_type(__return_storage_ptr__,local_32c,STRING);
            local_260._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_260,local_320._M_dataplus._M_p,
                       (char *)(local_320._M_string_length + (long)local_320._M_dataplus._M_p));
            Table::push_new_value_in_column(__return_storage_ptr__,local_32c,&local_260);
            paVar8 = paVar7;
            _Var12._M_p = local_260._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar7) goto LAB_0010639c;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_320,0,(char *)local_320._M_string_length,0x10c304);
          local_32c = local_32c + 1;
        }
        else {
          std::__cxx11::string::push_back(cVar4);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar3 != lVar11);
  } while( true );
}

Assistant:

Table getFromCsv(const std::string &fileName) {
    std::fstream in(fileName, std::ios::in);
    if (!in.is_open()){
        std::cerr << "File "+fileName+" can't be opened\n";
        exit(EXIT_FAILURE);
    }
    std::string str, cur;
    std::vector<std::string> columns;
    std::getline(in, str);
    str += ',';
    for (char ch:str){
        if (ch == ','){
            columns.push_back(cur);
            cur = "";
        }else
            cur += ch;
    }
    Table t(columns);
    bool is_defined = false;
    while (std::getline(in, str)){
        str += ',';
        if (!is_defined){
            int cnt = 0;
            for (char ch:str){
                if (ch == ' ') continue;
                if (ch == ','){
                    if (isdigit(cur[0])){
                        t.define_column_type(cnt, t.FLOAT);
                        t.push_new_value_in_column(cnt, cur);
                    }else{
                        t.define_column_type(cnt, t.STRING);
                        t.push_new_value_in_column(cnt, cur);
                    }
                    cur = "";
                    cnt++;
                }else
                    cur += ch;
            }
            is_defined = true;
            continue;
        }
        int cnt = 0;
        for (char ch:str){
            if (ch == ' ') continue;
            if (ch == ','){
                if (isdigit(cur[0])){
                    t.push_new_value_in_column(cnt, cur);
                }else{
                    t.push_new_value_in_column(cnt, cur);
                }
                cur = "";
                cnt++;
            }else
                cur += ch;
        }
    }
    return t;
}